

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O3

int __thiscall blc::tools::pipe::pipe(pipe *this,int *__pipedes)

{
  mutex *pmVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  int extraout_EAX;
  
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011aab8;
  (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_out = *(string **)(__pipedes + 6);
  pmVar1 = *(mutex **)(__pipedes + 4);
  this->_in = *(string **)(__pipedes + 2);
  this->_inMut = pmVar1;
  pmVar1 = *(mutex **)(__pipedes + 8);
  this->_outMut = pmVar1;
  this->_master = SUB41(__pipedes[10],0);
  iVar4 = (int)CONCAT71((int7)((ulong)pmVar1 >> 8),*(bool *)((long)__pipedes + 0x29));
  this->_block = *(bool *)((long)__pipedes + 0x29);
  peVar2 = *(element_type **)(__pipedes + 0xc);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__pipedes + 0xe);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = 0x11c230;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      this_00 = (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        return extraout_EAX;
      }
      return 0;
    }
    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
  }
  (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  return iVar4;
}

Assistant:

blc::tools::pipe::pipe(const pipe &other) {
	this->_in = const_cast<blc::tools::pipe &>(other).getIn();
	this->_out = const_cast<blc::tools::pipe &>(other).getOut();
	this->_inMut = const_cast<blc::tools::pipe &>(other).getInMut();
	this->_outMut = const_cast<blc::tools::pipe &>(other).getOutMut();
	this->_master = const_cast<blc::tools::pipe &>(other).getState();
	this->_block = const_cast<blc::tools::pipe &>(other).getBlock();
	this->_closed = const_cast<blc::tools::pipe &>(other).getClosed();
}